

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# try-qsort.c
# Opt level: O0

int comparewordcount_info_t(sort_order_enum order,wordcount_info_t *wcA,wordcount_info_t *wcB)

{
  wordcount_info_t *wcB_local;
  wordcount_info_t *wcA_local;
  sort_order_enum order_local;
  
  if (order == sort_order_ascending) {
    wcA_local._4_4_ = wcA->count - wcB->count;
  }
  else if (order == sort_order_descending) {
    wcA_local._4_4_ = -(wcA->count - wcB->count);
  }
  else {
    wcA_local._4_4_ = wcA->count - wcB->count;
  }
  return wcA_local._4_4_;
}

Assistant:

int comparewordcount_info_t(enum sort_order_enum order, wordcount_info_t * wcA, wordcount_info_t * wcB)
{
    //printf("A=%s/%d B=%s/%d\n", wcA->word, wcA->count, wcB->word, wcB->count);
    switch (order)
    {
    case sort_order_descending:
        return -(wcA->count - wcB->count);
    case sort_order_ascending:
        return wcA->count - wcB->count;
    default: /* also sort_order_ascending */
        return wcA->count - wcB->count;
    }
}